

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O0

RequiredExtensions *
deqp::gls::TextureStateQueryTests::anon_unknown_1::getTextureTargetExtension
          (RequiredExtensions *__return_storage_ptr__,ContextType *contextType,GLenum target)

{
  ContextType CVar1;
  bool bVar2;
  ApiType AVar3;
  GLenum target_local;
  ContextType *contextType_local;
  
  CVar1 = (ContextType)(contextType->super_ApiType).m_bits;
  AVar3 = glu::ApiType::es(3,2);
  bVar2 = glu::contextSupports(CVar1,AVar3);
  if (bVar2) {
    es32::getTextureTargetExtension(__return_storage_ptr__,target);
  }
  else {
    CVar1 = (ContextType)(contextType->super_ApiType).m_bits;
    AVar3 = glu::ApiType::es(3,1);
    bVar2 = glu::contextSupports(CVar1,AVar3);
    if (bVar2) {
      es31::getTextureTargetExtension(__return_storage_ptr__,target);
    }
    else {
      CVar1 = (ContextType)(contextType->super_ApiType).m_bits;
      AVar3 = glu::ApiType::es(3,0);
      bVar2 = glu::contextSupports(CVar1,AVar3);
      if (bVar2) {
        es30::getTextureTargetExtension(__return_storage_ptr__,target);
      }
      else {
        RequiredExtensions::RequiredExtensions(__return_storage_ptr__);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static RequiredExtensions getTextureTargetExtension (const glu::ContextType& contextType, glw::GLenum target)
{
	DE_ASSERT(!isCoreTextureTarget(contextType, target));

	if (contextSupports(contextType, glu::ApiType::es(3,2)))
		return es32::getTextureTargetExtension(target);
	if (contextSupports(contextType, glu::ApiType::es(3,1)))
		return es31::getTextureTargetExtension(target);
	else if (contextSupports(contextType, glu::ApiType::es(3,0)))
		return es30::getTextureTargetExtension(target);
	else
	{
		DE_ASSERT(false);
		return RequiredExtensions();
	}
}